

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void EncloseBodyText(TidyDocImpl *doc)

{
  Node *pNVar1;
  Bool BVar2;
  Node *pNVar3;
  bool bVar4;
  Node *next;
  Node *p;
  Node *body;
  Node *node;
  TidyDocImpl *doc_local;
  
  pNVar3 = prvTidyFindBody(doc);
  if (pNVar3 != (Node *)0x0) {
    body = pNVar3->content;
    while (body != (Node *)0x0) {
      BVar2 = prvTidynodeIsText(body);
      if (((BVar2 == no) || (BVar2 = prvTidyIsBlank(doc->lexer,body), BVar2 != no)) &&
         ((BVar2 = prvTidynodeIsElement(body), BVar2 == no ||
          (BVar2 = nodeCMIsOnlyInline(body), BVar2 == no)))) {
        body = body->next;
      }
      else {
        pNVar3 = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyInsertNodeBeforeElement(body,pNVar3);
        while( true ) {
          bVar4 = false;
          if (body != (Node *)0x0) {
            BVar2 = prvTidynodeIsElement(body);
            bVar4 = true;
            if (BVar2 != no) {
              BVar2 = nodeCMIsOnlyInline(body);
              bVar4 = BVar2 != no;
            }
          }
          if (!bVar4) break;
          pNVar1 = body->next;
          prvTidyRemoveNode(body);
          prvTidyInsertNodeAtEnd(pNVar3,body);
          body = pNVar1;
        }
        TrimSpaces(doc,pNVar3);
      }
    }
  }
  return;
}

Assistant:

static void EncloseBodyText(TidyDocImpl* doc)
{
    Node* node;
    Node* body = TY_(FindBody)(doc);

    if (!body)
        return;

    node = body->content;

    while (node)
    {
        if ((TY_(nodeIsText)(node) && !TY_(IsBlank)(doc->lexer, node)) ||
            (TY_(nodeIsElement)(node) && nodeCMIsOnlyInline(node)))
        {
            Node* p = TY_(InferredTag)(doc, TidyTag_P);
            TY_(InsertNodeBeforeElement)(node, p);
            while (node && (!TY_(nodeIsElement)(node) || nodeCMIsOnlyInline(node)))
            {
                Node* next = node->next;
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(p, node);
                node = next;
            }
            TrimSpaces(doc, p);
            continue;
        }
        node = node->next;
    }
}